

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

mpack_error_t mpack_writer_destroy(mpack_writer_t *writer)

{
  size_t sVar1;
  
  if (writer->error == mpack_ok) {
    sVar1 = (long)writer->current - (long)writer->buffer;
    if ((sVar1 != 0) && (writer->flush != (mpack_writer_flush_t)0x0)) {
      (*writer->flush)(writer,writer->buffer,sVar1);
      writer->flush = (mpack_writer_flush_t)0x0;
    }
  }
  if (writer->teardown != (mpack_writer_teardown_t)0x0) {
    (*writer->teardown)(writer);
    writer->teardown = (mpack_writer_teardown_t)0x0;
  }
  return writer->error;
}

Assistant:

mpack_error_t mpack_writer_destroy(mpack_writer_t* writer) {

    // clean up tracking, asserting if we're not already in an error state
    #if MPACK_WRITE_TRACKING
    mpack_track_destroy(&writer->track, writer->error != mpack_ok);
    #endif

    // flush any outstanding data
    if (mpack_writer_error(writer) == mpack_ok && mpack_writer_buffer_used(writer) != 0 && writer->flush != NULL) {
        writer->flush(writer, writer->buffer, mpack_writer_buffer_used(writer));
        writer->flush = NULL;
    }

    if (writer->teardown) {
        writer->teardown(writer);
        writer->teardown = NULL;
    }

    return writer->error;
}